

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

Own<kj::_::SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_test_c__:676:27)>,_kj::_::PromiseDisposer>
 __thiscall
kj::_::PromiseDisposer::
appendPromise<kj::_::SimpleTransformPromiseNode<void,kj::(anonymous_namespace)::TestCase641::run()::__4>,kj::_::PromiseDisposer,kj::(anonymous_namespace)::TestCase641::run()::__4,void*&>
          (PromiseDisposer *this,OwnPromiseNode *next,Type *params,void **params_1)

{
  PromiseArena *pPVar1;
  PromiseNode *pPVar2;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *pOVar3;
  Type *pTVar4;
  void **ppvVar5;
  PromiseArena **location;
  SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_test_c__:676:27)>
  *ptr;
  PromiseArena *arena;
  void **params_local_1;
  Type *params_local;
  OwnPromiseNode *next_local;
  
  pPVar2 = Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::operator->(next);
  pPVar1 = (pPVar2->super_PromiseArenaMember).arena;
  if ((pPVar1 == (PromiseArena *)0x0) ||
     (pPVar2 = Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::get(next),
     (ulong)((long)pPVar2 - (long)pPVar1) < 0x28)) {
    pOVar3 = mv<kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>>(next);
    pTVar4 = fwd<kj::(anonymous_namespace)::TestCase641::run()::__4>(params);
    ppvVar5 = fwd<void*&>(params_1);
    alloc<kj::_::SimpleTransformPromiseNode<void,kj::(anonymous_namespace)::TestCase641::run()::__4>,kj::_::PromiseDisposer,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::TestCase641::run()::__4,void*&>
              (this,pOVar3,pTVar4,ppvVar5);
  }
  else {
    pPVar2 = Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::operator->(next);
    (pPVar2->super_PromiseArenaMember).arena = (PromiseArena *)0x0;
    pPVar2 = Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::get(next);
    location = &pPVar2[-3].super_PromiseArenaMember.arena;
    pOVar3 = mv<kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>>(next);
    pTVar4 = fwd<kj::(anonymous_namespace)::TestCase641::run()::__4>(params);
    ppvVar5 = fwd<void*&>(params_1);
    ctor<kj::_::SimpleTransformPromiseNode<void,kj::(anonymous_namespace)::TestCase641::run()::__4>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::TestCase641::run()::__4,void*&>
              ((SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_test_c__:676:27)>
                *)location,pOVar3,pTVar4,ppvVar5);
    pPVar2[-2].super_PromiseArenaMember._vptr_PromiseArenaMember = (_func_int **)pPVar1;
    Own<kj::_::SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:676:27)>,_kj::_::PromiseDisposer>
    ::Own((Own<kj::_::SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_test_c__:676:27)>,_kj::_::PromiseDisposer>
           *)this,(SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_test_c__:676:27)>
                   *)location);
  }
  return (Own<kj::_::SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_test_c__:676:27)>,_kj::_::PromiseDisposer>
          )(SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_test_c__:676:27)>
            *)this;
}

Assistant:

static kj::Own<T, D> appendPromise(
      OwnPromiseNode&& next, Params&&... params) noexcept {
    // Append a promise to the arena that currently ends with `next`. `next` is also still passed as
    // the first parameter to the new object's constructor.
    //
    // This is semantically the same as `allocPromise()` except that it may avoid the underlying
    // memory allocation. `next` must end up being destroyed before the new object (i.e. the new
    // object must never transfer away ownership of `next`).


    PromiseArena* arena = next->arena;

    if (!canArenaAllocate<T>() || arena == nullptr ||
        reinterpret_cast<byte*>(next.get()) - reinterpret_cast<byte*>(arena) < sizeof(T)) {
      // No arena available, or not enough space, or weird alignment needed. Start new arena.
      return alloc<T, D>(kj::mv(next), kj::fwd<Params>(params)...);
    } else {
      // Append to arena.
      //
      // NOTE: When we call ctor(), it takes ownership of `next`, so we shouldn't assume `next`
      //   still exists after it returns. So we have to remove ownership of the arena before that.
      //   In theory if we wanted this to be exception-safe, we'd also have to arrange to delete
      //   the arena if the constructor throws. However, in practice none of the PromiseNode
      //   constructors throw, so we just mark the whole method noexcept in order to avoid the
      //   code bloat to handle this case.
      next->arena = nullptr;
      T* ptr = reinterpret_cast<T*>(next.get()) - 1;
      ctor(*ptr, kj::mv(next), kj::fwd<Params>(params)...);
      ptr->arena = arena;
      KJ_IREQUIRE(reinterpret_cast<void*>(ptr) ==
                  reinterpret_cast<void*>(static_cast<PromiseArenaMember*>(ptr)),
          "PromiseArenaMember must be the leftmost inherited type.");
      return kj::Own<T, D>(ptr);
    }
  }